

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void serialize_node<std::ostream>
               (ImputeNode *node,basic_ostream<char,_std::char_traits<char>_> *out)

{
  bool bVar1;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  *__lhs;
  size_type sVar2;
  reference this;
  double *n_els;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *v;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  size_t veclen;
  size_t data_sizets [5];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_50;
  vector<double,_std::allocator<double>_> *local_48;
  size_type local_40;
  pointer local_38;
  size_type local_30;
  size_type local_28;
  size_type local_20;
  size_type local_18;
  vector<double,_std::allocator<double>_> *local_8;
  
  if (!interrupt_switch) {
    local_38 = in_RDI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_8 = in_RDI;
    local_30 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
    local_28 = std::vector<double,_std::allocator<double>_>::size(local_8 + 1);
    local_20 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)(local_8 + 2));
    local_18 = std::vector<double,_std::allocator<double>_>::size(local_8 + 3);
    write_bytes<unsigned_long>
              (in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,(ostream *)0x673319);
    __lhs = (__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
             *)std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x673323);
    std::vector<double,_std::allocator<double>_>::size(local_8);
    write_bytes<double>(__lhs,(size_t)in_stack_ffffffffffffff88,(ostream *)0x673344);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x673352);
    std::vector<double,_std::allocator<double>_>::size(local_8 + 1);
    write_bytes<double>(__lhs,(size_t)in_stack_ffffffffffffff88,(ostream *)0x673377);
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(local_8 + 2));
    if (sVar2 != 0) {
      local_48 = local_8 + 2;
      local_50._M_current =
           (vector<double,_std::allocator<double>_> *)
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(in_stack_ffffffffffffff88);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::end(in_stack_ffffffffffffff88);
      while (bVar1 = __gnu_cxx::operator!=
                               (__lhs,(__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                       *)in_stack_ffffffffffffff88), bVar1) {
        this = __gnu_cxx::
               __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator*(&local_50);
        local_40 = std::vector<double,_std::allocator<double>_>::size(this);
        write_bytes<unsigned_long>(__lhs,(size_t)in_stack_ffffffffffffff88,(ostream *)0x673402);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x67340c);
        write_bytes<double>(__lhs,(size_t)in_stack_ffffffffffffff88,(ostream *)0x67341e);
        __gnu_cxx::
        __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator++(&local_50);
      }
    }
    n_els = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x67343a);
    std::vector<double,_std::allocator<double>_>::size(local_8 + 3);
    write_bytes<double>(__lhs,(size_t)n_els,(ostream *)0x67345d);
  }
  return;
}

Assistant:

void serialize_node(const ImputeNode &node, otype &out)
{
    if (interrupt_switch) return;

    size_t data_sizets[] = {
        node.parent,
        node.num_sum.size(),
        node.num_weight.size(),
        node.cat_sum.size(),
        node.cat_weight.size(),
    };
    write_bytes<size_t>((void*)data_sizets, (size_t)5, out);

    write_bytes<double>((void*)node.num_sum.data(), node.num_sum.size(), out);

    write_bytes<double>((void*)node.num_weight.data(), node.num_weight.size(), out);

    if (node.cat_sum.size()) {
        size_t veclen;
        for (const auto &v : node.cat_sum) {
            veclen = v.size();
            write_bytes<size_t>((void*)&veclen, (size_t)1, out);
            write_bytes<double>((void*)v.data(), veclen, out);
        }
    }

    write_bytes<double>((void*)node.cat_weight.data(), node.cat_weight.size(), out);
}